

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

int kwssys::kwsysUnPutEnv(string *env)

{
  long lVar1;
  int iVar2;
  string name;
  
  lVar1 = std::__cxx11::string::find((char)env,0x3d);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&name,(ulong)env);
    unsetenv(name._M_dataplus._M_p);
    iVar2 = std::__cxx11::string::~string((string *)&name);
    return iVar2;
  }
  iVar2 = unsetenv((env->_M_dataplus)._M_p);
  return iVar2;
}

Assistant:

static int kwsysUnPutEnv(const std::string& env)
{
  size_t pos = env.find('=');
  if (pos != std::string::npos) {
    std::string name = env.substr(0, pos);
    unsetenv(name.c_str());
  } else {
    unsetenv(env.c_str());
  }
  return 0;
}